

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O3

int Abc_NtkRRUpdate(Abc_Ntk_t *pNtk,Abc_Obj_t *pNode,Abc_Obj_t *pFanin,Abc_Obj_t *pFanout)

{
  int *piVar1;
  void **ppvVar2;
  Abc_Obj_t *pAVar3;
  int extraout_EAX;
  Abc_Obj_t *pAVar4;
  int iVar5;
  bool bVar6;
  
  if (pFanout != (Abc_Obj_t *)0x0) {
    __assert_fail("pFanout == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRr.c"
                  ,0x184,"int Abc_NtkRRUpdate(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  if (((ulong)pNode & 1) == 0) {
    if (((ulong)pFanin & 1) != 0) {
      __assert_fail("!Abc_ObjIsComplement(pFanin)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRr.c"
                    ,0x186,"int Abc_NtkRRUpdate(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)"
                   );
    }
    piVar1 = (pNode->vFanins).pArray;
    ppvVar2 = pNode->pNtk->vObjs->pArray;
    pAVar3 = (Abc_Obj_t *)ppvVar2[*piVar1];
    pAVar4 = (Abc_Obj_t *)ppvVar2[piVar1[1]];
    if (pAVar3 == pFanin) {
      iVar5 = 0xb;
    }
    else {
      iVar5 = 10;
      bVar6 = pAVar4 != pFanin;
      pAVar4 = pAVar3;
      if (bVar6) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRr.c"
                      ,0x18d,
                      "int Abc_NtkRRUpdate(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
      }
    }
    Abc_AigReplace((Abc_Aig_t *)pNtk->pManFunc,pNode,
                   (Abc_Obj_t *)
                   ((ulong)((*(uint *)&pNode->field_0x14 >> iVar5 & 1) != 0) ^ (ulong)pAVar4),1);
    return extraout_EAX;
  }
  __assert_fail("!Abc_ObjIsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRr.c"
                ,0x185,"int Abc_NtkRRUpdate(Abc_Ntk_t *, Abc_Obj_t *, Abc_Obj_t *, Abc_Obj_t *)");
}

Assistant:

int Abc_NtkRRUpdate( Abc_Ntk_t * pNtk, Abc_Obj_t * pNode, Abc_Obj_t * pFanin, Abc_Obj_t * pFanout )
{
    Abc_Obj_t * pNodeNew, * pFanoutNew;
    assert( pFanout == NULL );
    assert( !Abc_ObjIsComplement(pNode) );
    assert( !Abc_ObjIsComplement(pFanin) );
    assert( !Abc_ObjIsComplement(pFanout) );
    // find the node after redundancy removal
    if ( pFanin == Abc_ObjFanin0(pNode) )
        pNodeNew = Abc_ObjChild1(pNode);
    else if ( pFanin == Abc_ObjFanin1(pNode) )
        pNodeNew = Abc_ObjChild0(pNode);
    else assert( 0 );
    // replace
    if ( pFanout == NULL )
    {
        Abc_AigReplace( (Abc_Aig_t *)pNtk->pManFunc, pNode, pNodeNew, 1 );
        return 1;
    }
    // find the fanout after redundancy removal
    if ( pNode == Abc_ObjFanin0(pFanout) )
        pFanoutNew = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjNotCond(pNodeNew,Abc_ObjFaninC0(pFanout)), Abc_ObjChild1(pFanout) );
    else if ( pNode == Abc_ObjFanin1(pFanout) )
        pFanoutNew = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, Abc_ObjNotCond(pNodeNew,Abc_ObjFaninC1(pFanout)), Abc_ObjChild0(pFanout) );
    else assert( 0 );
    // replace
    Abc_AigReplace( (Abc_Aig_t *)pNtk->pManFunc, pFanout, pFanoutNew, 1 );
    return 1;
}